

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Random_keys.cpp
# Opt level: O3

int __thiscall
Random_keys::avancaGeracaoesAdaptativo
          (Random_keys *this,Graph *g,int it_s_melhora,float maxMutacao,float max_pct,
          float taxaTamMut,float taxaPctMut)

{
  pointer ppRVar1;
  RK_Individual *pRVar2;
  double dVar3;
  int iVar4;
  uint uVar5;
  ulong uVar6;
  int iVar7;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  ulong uVar11;
  Random_keys *this_00;
  ulong uVar12;
  uint uVar13;
  uint uVar14;
  undefined4 uVar15;
  undefined4 uVar16;
  float fVar17;
  float fVar18;
  vector<int,_std::allocator<int>_> chamadaGeracao;
  int local_c0;
  int local_bc;
  int *local_b8;
  iterator iStack_b0;
  int *local_a8;
  double local_98;
  float local_90;
  float local_8c;
  float local_88;
  float local_84;
  int local_80;
  int local_7c;
  undefined8 local_78;
  undefined8 uStack_70;
  undefined8 local_68;
  undefined8 uStack_60;
  Graph *local_50;
  vector<RK_Individual_*,_std::allocator<RK_Individual_*>_> *local_48;
  vector<RK_Individual_*,_std::allocator<RK_Individual_*>_> *local_40;
  double local_38;
  
  local_b8 = (int *)0x0;
  iStack_b0._M_current = (int *)0x0;
  local_a8 = (int *)0x0;
  ppRVar1 = (this->popAtual).super__Vector_base<RK_Individual_*,_std::allocator<RK_Individual_*>_>.
            _M_impl.super__Vector_impl_data._M_start;
  local_90 = maxMutacao;
  local_8c = max_pct;
  local_88 = taxaTamMut;
  local_84 = taxaPctMut;
  local_80 = it_s_melhora;
  if ((ulong)((long)(this->popAtual).
                    super__Vector_base<RK_Individual_*,_std::allocator<RK_Individual_*>_>._M_impl.
                    super__Vector_impl_data._M_finish - (long)ppRVar1 >> 3) <=
      (long)this->tamPop - 1U) {
    std::__throw_out_of_range_fmt
              ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)");
  }
  pRVar2 = ppRVar1[(long)this->tamPop + -1];
  ordenaPopulacaoAtual(this,g);
  local_bc = 0;
  if (this->numGeracoes < 1) {
    iVar4 = 0;
  }
  else {
    local_98 = pRVar2->active_loss * 100000.0;
    local_40 = &this->popAtual;
    local_48 = &this->popAnterior;
    local_68 = 0x3dcccccd;
    uStack_60 = 0;
    local_78 = 0x3d4ccccd;
    uStack_70 = 0;
    local_c0 = 0;
    iVar4 = 0;
    local_50 = g;
    do {
      ordenaPopulacaoAtual(this,local_50);
      ppRVar1 = (this->popAtual).
                super__Vector_base<RK_Individual_*,_std::allocator<RK_Individual_*>_>._M_impl.
                super__Vector_impl_data._M_start;
      if ((ulong)((long)(this->popAtual).
                        super__Vector_base<RK_Individual_*,_std::allocator<RK_Individual_*>_>.
                        _M_impl.super__Vector_impl_data._M_finish - (long)ppRVar1 >> 3) <=
          (long)this->tamPop - 1U) {
        std::__throw_out_of_range_fmt
                  ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)");
      }
      local_38 = ppRVar1[(long)this->tamPop + -1]->active_loss * 100000.0;
      local_c0 = local_c0 + 1;
      if (local_38 < local_98) {
        local_c0 = 0;
        iVar4 = local_bc;
      }
      if (local_c0 == local_80) {
        fVar17 = (float)(~-(uint)((float)local_78 < local_90) & (uint)(float)local_78 |
                        (uint)((float)local_78 * local_88) & -(uint)((float)local_78 < local_90));
        fVar18 = (float)(~-(uint)((float)local_68 < local_8c) & (uint)(float)local_68 |
                        (uint)((float)local_68 * local_84) & -(uint)((float)local_68 < local_8c));
        local_68 = CONCAT44(local_68._4_4_,fVar18);
        local_78 = CONCAT44(local_78._4_4_,fVar17);
        if ((fVar18 < local_8c) || (fVar17 < local_90)) {
          if (iStack_b0._M_current == local_a8) {
            local_c0 = 0;
            std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                      ((vector<int,std::allocator<int>> *)&local_b8,iStack_b0,&local_bc);
          }
          else {
            local_c0 = 0;
            *iStack_b0._M_current = local_bc;
            iStack_b0._M_current = iStack_b0._M_current + 1;
          }
        }
        else {
          local_c0 = 0;
        }
      }
      std::vector<RK_Individual_*,_std::allocator<RK_Individual_*>_>::operator=(local_48,local_40);
      dVar3 = (double)this->tamPop;
      uVar13 = (uint)(dVar3 * 0.05);
      iVar7 = (int)(dVar3 * 0.1);
      local_7c = iVar4;
      if ((int)uVar13 < this->tamPop - iVar7) {
        uVar12 = (ulong)(int)uVar13;
        do {
          rand();
          iVar4 = rand();
          uVar14 = iVar4 % this->tamPop;
          iVar4 = rand();
          uVar5 = iVar4 % this->tamPop;
          iVar4 = rand();
          uVar10 = (long)iVar4 % (long)this->tamPop;
          uVar9 = uVar10 & 0xffffffff;
          uVar8 = (ulong)(int)uVar14;
          ppRVar1 = (this->popAnterior).
                    super__Vector_base<RK_Individual_*,_std::allocator<RK_Individual_*>_>._M_impl.
                    super__Vector_impl_data._M_start;
          uVar6 = (long)(this->popAnterior).
                        super__Vector_base<RK_Individual_*,_std::allocator<RK_Individual_*>_>.
                        _M_impl.super__Vector_impl_data._M_finish - (long)ppRVar1 >> 3;
          uVar11 = uVar8;
          if ((uVar6 <= uVar8) || (uVar11 = (ulong)(int)uVar5, uVar6 <= uVar11)) {
LAB_00107f67:
            std::__throw_out_of_range_fmt
                      ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",
                       uVar11);
          }
          if (ppRVar1[uVar8]->active_loss <= ppRVar1[uVar11]->active_loss &&
              ppRVar1[uVar11]->active_loss != ppRVar1[uVar8]->active_loss) {
            uVar5 = uVar14;
          }
          uVar8 = (ulong)(int)uVar5;
          uVar11 = uVar8;
          if ((uVar6 <= uVar8) || (uVar11 = (ulong)(int)uVar10, uVar6 <= uVar11)) goto LAB_00107f67;
          if (ppRVar1[uVar8]->active_loss <= ppRVar1[uVar11]->active_loss &&
              ppRVar1[uVar11]->active_loss != ppRVar1[uVar8]->active_loss) {
            uVar9 = (ulong)uVar5;
          }
          do {
            iVar4 = rand();
            iVar4 = iVar4 % this->tamPop;
          } while (iVar4 == (int)uVar9);
          uVar9 = (ulong)(int)uVar9;
          ppRVar1 = (this->popAnterior).
                    super__Vector_base<RK_Individual_*,_std::allocator<RK_Individual_*>_>._M_impl.
                    super__Vector_impl_data._M_start;
          uVar11 = (long)(this->popAnterior).
                         super__Vector_base<RK_Individual_*,_std::allocator<RK_Individual_*>_>.
                         _M_impl.super__Vector_impl_data._M_finish - (long)ppRVar1 >> 3;
          uVar10 = uVar9;
          if (((uVar11 <= uVar9) || (uVar6 = (ulong)iVar4, uVar10 = uVar6, uVar11 <= uVar6)) ||
             (this_00 = (Random_keys *)
                        (this->popAtual).
                        super__Vector_base<RK_Individual_*,_std::allocator<RK_Individual_*>_>.
                        _M_impl.super__Vector_impl_data._M_start, uVar10 = uVar12,
             (ulong)((long)(this->popAtual).
                           super__Vector_base<RK_Individual_*,_std::allocator<RK_Individual_*>_>.
                           _M_impl.super__Vector_impl_data._M_finish - (long)this_00 >> 3) <= uVar12
             )) {
LAB_00107f51:
            std::__throw_out_of_range_fmt
                      ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",
                       uVar10);
          }
          cruzamento2(this_00,ppRVar1[uVar9],ppRVar1[uVar6],
                      *(RK_Individual **)(&this_00->numGeracoes + uVar12 * 2));
          ppRVar1 = (this->popAtual).
                    super__Vector_base<RK_Individual_*,_std::allocator<RK_Individual_*>_>._M_impl.
                    super__Vector_impl_data._M_start;
          if ((ulong)((long)(this->popAtual).
                            super__Vector_base<RK_Individual_*,_std::allocator<RK_Individual_*>_>.
                            _M_impl.super__Vector_impl_data._M_finish - (long)ppRVar1 >> 3) <=
              uVar12) goto LAB_00107f51;
          mutacaoAdaptavitva(this_00,ppRVar1[uVar12],(float)local_78,(float)local_68);
          uVar12 = uVar12 + 1;
        } while ((long)uVar12 < (long)this->tamPop - (long)iVar7);
      }
      if (0 < (int)uVar13) {
        uVar12 = 0;
        do {
          ppRVar1 = (this->popAtual).
                    super__Vector_base<RK_Individual_*,_std::allocator<RK_Individual_*>_>._M_impl.
                    super__Vector_impl_data._M_start;
          if ((ulong)((long)(this->popAtual).
                            super__Vector_base<RK_Individual_*,_std::allocator<RK_Individual_*>_>.
                            _M_impl.super__Vector_impl_data._M_finish - (long)ppRVar1 >> 3) <=
              uVar12) {
            std::__throw_out_of_range_fmt
                      ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",
                       uVar12);
          }
          RK_Individual::generate_random_weights(ppRVar1[uVar12]);
          uVar12 = uVar12 + 1;
        } while (uVar13 != uVar12);
      }
      uVar15 = SUB84(local_38,0);
      uVar16 = (undefined4)((ulong)local_38 >> 0x20);
      if (local_98 <= local_38) {
        uVar15 = SUB84(local_98,0);
        uVar16 = (undefined4)((ulong)local_98 >> 0x20);
      }
      local_bc = local_bc + 1;
      local_98 = (double)CONCAT44(uVar16,uVar15);
      g = local_50;
      iVar4 = local_7c;
    } while (local_bc < this->numGeracoes);
  }
  ordenaPopulacaoAtual(this,g);
  if (iStack_b0._M_current != local_b8) {
    uVar12 = 0;
    do {
      printf("%d,",(ulong)(uint)local_b8[uVar12]);
      uVar12 = uVar12 + 1;
    } while (uVar12 < (ulong)((long)iStack_b0._M_current - (long)local_b8 >> 2));
  }
  if (local_b8 != (int *)0x0) {
    operator_delete(local_b8,(long)local_a8 - (long)local_b8);
  }
  return iVar4;
}

Assistant:

int Random_keys::avancaGeracaoesAdaptativo(Graph *g, int it_s_melhora, float maxMutacao, float max_pct, float taxaTamMut, float taxaPctMut) {

    int it=0;
    vector<int> chamadaGeracao;

    ///parametros da mutacao adaptativa
    float tamMutacao = 0.05;
    float pctMutacao = 0.1;
    ///--------------------------------

    int melhorGeracao = 0;
    RK_Individual *best = popAtual.at(this->tamPop - 1);
    this->ordenaPopulacaoAtual(g);
    double perda = 100*1000*best->getActiveLoss();
    for(int k=0; k<this->numGeracoes; k++){

        /** calcula a funcao criterio para cada individuo
         e ordena a populacao da maior perda(pior individuo)
         pra menor perda(melhor individuo), perdaAtiva**/
        this->ordenaPopulacaoAtual(g);

        RK_Individual *best = popAtual.at(this->tamPop - 1);
        if (100*1000*best->getActiveLoss() < perda){
            perda = 100*1000*best->getActiveLoss();
//            printf("\ngeracao (%d)  melhor individuo: %lf kw", k, 100*1000*best->getPerdaAtiva());//resultado ja em kw
            melhorGeracao = k;
            it=0;
        }else{
            it++;
        }

        if(it==it_s_melhora){
            if(tamMutacao<maxMutacao)
                tamMutacao*=taxaTamMut;
            if(pctMutacao<max_pct)
                pctMutacao*=taxaPctMut;
            if(pctMutacao<max_pct || tamMutacao<maxMutacao){
                chamadaGeracao.push_back(k);
//                printf("(%f, %f)", tamMutacao, pctMutacao);
            }
            it=0;
        }

        popAnterior = popAtual;

        int num_piores = 0.05*this->tamPop;
        int num_melhores = 0.1*this->tamPop;

        for(int i=num_piores; i<this->tamPop-num_melhores; i++){

            /** cruzamento entre pai1 e pai2 entre os
            individuos aleatorios da populacao anterior
            modificar por uma escolha em roleta no futuro**/
            int pai1 = rand() % this->tamPop;
//            int pai2 = rand() % this->tamPop; //aleatorio

            /*torneio com 3*/
            int cand1, cand2, cand3;
            cand1 = rand() % this->tamPop;
            cand2 = rand() % this->tamPop;
            cand3 = rand() % this->tamPop;

            int aux = cand1;

            if(popAnterior.at(cand1)->getActiveLoss() < popAnterior.at(cand2)->getActiveLoss()){
                cand2=cand1;
            }else{aux = cand2;}
            if(popAnterior.at(cand2)->getActiveLoss() < popAnterior.at(cand3)->getActiveLoss()){
                cand3=cand2;
            }else{aux = cand3;}
            pai1 = aux;

            int pai2 = cand3;

            while(pai2==pai1)
                pai2 = rand() % this->tamPop;

//            popAnterior.at(pai1)->cruzamentoMedia2(popAnterior.at(pai2), popAtual.at(i));
            this->cruzamento2(popAnterior.at(pai1), popAnterior.at(pai2), popAtual.at(i));
//            popAtual.at(i)->mutacao();

            this->mutacaoAdaptavitva(popAtual.at(i), tamMutacao, pctMutacao);
        }

        /**aleatorio ao inves de manter piores**/
        for(int i=0; i<num_piores; i++)
            popAtual.at(i)->generate_random_weights();
    }

//    cout << "\n--------------------------------------"<<endl;
//    for(unsigned int i=0; i<popAtual.size(); i++)
//        cout << 100*1000*popAtual.at(i)->getPerdaAtiva() << " , ";
//    cout << "\n--------------------------------------"<<endl;

    this->ordenaPopulacaoAtual(g);

    for(unsigned long int i=0; i<chamadaGeracao.size();i++)
        printf("%d,", chamadaGeracao.at(i));

    return melhorGeracao;
}